

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

void __thiscall
MppMemService::add_log
          (MppMemService *this,MppMemOps ops,char *caller,void *ptr,void *ret,size_t size_0,
          size_t size_1)

{
  RK_U32 RVar1;
  MppMemService *pMVar2;
  MppMemLog *pMVar3;
  MppMemLog *log;
  MppMemService *srv;
  size_t size_0_local;
  void *ret_local;
  void *ptr_local;
  char *caller_local;
  MppMemOps ops_local;
  MppMemService *this_local;
  
  pMVar2 = get_inst();
  pMVar3 = this->logs + this->log_idx;
  if ((pMVar2->debug & 2) != 0) {
    _mpp_log_l(4,"mpp_mem","%-7s ptr %010p %010p size %8u %8u at %s\n",(char *)0x0,ops2str[ops],ptr,
               ret,size_0,size_1,caller);
  }
  RVar1 = this->log_index;
  this->log_index = RVar1 + 1;
  pMVar3->index = RVar1;
  pMVar3->ops = ops;
  pMVar3->size_0 = size_0;
  pMVar3->size_1 = size_1;
  pMVar3->ptr = ptr;
  pMVar3->ret = ret;
  pMVar3->node = (MppMemNode *)0x0;
  pMVar3->caller = caller;
  this->log_idx = this->log_idx + 1;
  if (this->log_max <= this->log_idx) {
    this->log_idx = 0;
  }
  if (this->log_cnt < this->log_max) {
    this->log_cnt = this->log_cnt + 1;
  }
  return;
}

Assistant:

void MppMemService::add_log(MppMemOps ops, const char *caller,
                            void *ptr, void *ret, size_t size_0, size_t size_1)
{
    MppMemService *srv = MppMemService::get_inst();
    MppMemLog *log = &logs[log_idx];

    if (srv->debug & MEM_RUNTIME_LOG)
        mpp_log("%-7s ptr %010p %010p size %8u %8u at %s\n",
                ops2str[ops], ptr, ret, size_0, size_1, caller);

    log->index  = log_index++;
    log->ops    = ops;
    log->size_0 = size_0;
    log->size_1 = size_1;
    log->ptr    = ptr;
    log->ret    = ret;
    log->node   = NULL;
    log->caller = caller;

    log_idx++;
    if (log_idx >= log_max)
        log_idx = 0;

    if (log_cnt < log_max)
        log_cnt++;
}